

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void purge_logically_deleted_doc_test(void)

{
  size_t keylen;
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_doc *pfVar5;
  size_t sVar6;
  fdb_kvs_handle *pfVar7;
  size_t sVar8;
  size_t sVar9;
  fdb_kvs_handle **ppfVar10;
  ulong uVar11;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *handle;
  long lVar13;
  fdb_config *pfVar14;
  fdb_doc *pfVar15;
  char *ptr_handle;
  uint uVar16;
  char *unaff_RBP;
  fdb_encryption_key *pfVar17;
  fdb_config *unaff_R12;
  fdb_iterator **doc_00;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  fdb_doc **doc_01;
  fdb_iterator **ptr_iterator;
  fdb_doc **ppfVar18;
  char *pcVar19;
  fdb_kvs_handle **ptr_handle_00;
  char *pcVar20;
  bool bVar21;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1ce90;
  fdb_file_handle *pfStack_1ce88;
  void *pvStack_1ce80;
  size_t asStack_1ce78 [3];
  undefined4 uStack_1ce60;
  undefined4 uStack_1ce5c;
  undefined4 uStack_1ce58;
  undefined4 uStack_1ce54;
  undefined4 uStack_1ce50;
  fdb_kvs_config fStack_1ce48;
  timeval tStack_1ce30;
  fdb_config fStack_1ce20;
  char acStack_1cd28 [256];
  char acStack_1cc28 [256];
  char acStack_1cb28 [264];
  fdb_config *pfStack_1ca20;
  fdb_iterator **ppfStack_1ca18;
  fdb_kvs_handle *pfStack_1ca10;
  fdb_iterator **ppfStack_1ca08;
  fdb_kvs_handle *pfStack_1ca00;
  code *pcStack_1c9f8;
  fdb_iterator *pfStack_1c9e0;
  fdb_file_handle *pfStack_1c9d8;
  fdb_kvs_handle *pfStack_1c9d0;
  fdb_kvs_handle *pfStack_1c9c8;
  fdb_kvs_config fStack_1c9c0;
  timeval tStack_1c9a8;
  fdb_config fStack_1c998;
  fdb_iterator *apfStack_1c8a0 [32];
  fdb_config fStack_1c7a0;
  fdb_kvs_handle **ppfStack_1c698;
  fdb_iterator **ppfStack_1c690;
  fdb_iterator **ppfStack_1c688;
  fdb_kvs_handle *pfStack_1c680;
  fdb_iterator *pfStack_1c670;
  fdb_kvs_handle *pfStack_1c668;
  fdb_iterator **ppfStack_1c660;
  fdb_kvs_handle *pfStack_1c658;
  fdb_kvs_config fStack_1c650;
  fdb_kvs_handle *apfStack_1c638 [8];
  undefined1 auStack_1c5f8 [64];
  fdb_iterator *apfStack_1c5b8 [33];
  fdb_config fStack_1c4b0;
  fdb_iterator *apfStack_1c3b8 [32];
  fdb_iterator *apfStack_1c2b8 [32];
  fdb_kvs_handle fStack_1c1b8;
  undefined8 auStack_1bdb8 [896];
  fdb_kvs_handle *apfStack_1a1b8 [1025];
  fdb_doc **ppfStack_181b0;
  char *pcStack_181a8;
  long lStack_181a0;
  fdb_doc *pfStack_18198;
  fdb_doc **ppfStack_18190;
  fdb_doc *pfStack_18188;
  fdb_doc *pfStack_18170;
  fdb_file_handle *pfStack_18168;
  long lStack_18160;
  fdb_kvs_handle *pfStack_18158;
  long lStack_18150;
  long lStack_18148;
  fdb_doc **ppfStack_18140;
  long lStack_18138;
  fdb_doc **ppfStack_18130;
  size_t sStack_18128;
  timeval tStack_18120;
  fdb_kvs_config fStack_18110;
  fdb_file_info fStack_180f8;
  fdb_doc afStack_180b0 [3];
  char acStack_17fb0 [264];
  fdb_config fStack_17ea8;
  char acStack_17db0 [256];
  fdb_doc *apfStack_17cb0 [2999];
  size_t sStack_11ef8;
  size_t asStack_11ef0 [1023];
  undefined1 auStack_fef1 [57225];
  fdb_doc **ppfStack_1f68;
  fdb_config *pfStack_1f60;
  fdb_file_handle **ppfStack_1f58;
  ulong uStack_1f50;
  fdb_kvs_handle **ppfStack_1f48;
  fdb_kvs_handle **ppfStack_1f40;
  fdb_doc *pfStack_1f28;
  fdb_kvs_handle *pfStack_1f20;
  undefined1 auStack_1f18 [24];
  fdb_file_handle *pfStack_1f00;
  fdb_kvs_handle *pfStack_1ef8;
  fdb_kvs_config fStack_1ef0;
  fdb_doc *apfStack_1ed8 [31];
  timeval tStack_1de0;
  fdb_config fStack_1dd0;
  char acStack_1cd8 [256];
  fdb_file_handle *apfStack_1bd8 [32];
  char acStack_1ad8 [264];
  fdb_kvs_handle **ppfStack_19d0;
  char *pcStack_19c8;
  char *pcStack_19c0;
  ulong uStack_19b8;
  undefined8 uStack_19b0;
  code *pcStack_19a8;
  fdb_file_handle *pfStack_19a0;
  fdb_kvs_handle *pfStack_1998;
  char acStack_1990 [32];
  fdb_kvs_config fStack_1970;
  timeval tStack_1958;
  fdb_file_info afStack_1948 [3];
  fdb_config fStack_1850;
  fdb_config *pfStack_1758;
  fdb_kvs_handle **ppfStack_1750;
  fdb_kvs_handle *pfStack_1748;
  fdb_doc *pfStack_1740;
  fdb_kvs_handle *pfStack_1738;
  fdb_encryption_key *pfStack_1730;
  fdb_kvs_handle *pfStack_1720;
  fdb_file_handle *pfStack_1718;
  undefined1 auStack_1710 [8];
  undefined1 auStack_1708 [48];
  fdb_kvs_handle *apfStack_16d8 [32];
  fdb_doc afStack_15d8 [3];
  fdb_config fStack_14d8;
  ulong uStack_13e0;
  fdb_kvs_handle **ppfStack_13d8;
  fdb_kvs_handle *pfStack_13d0;
  fdb_doc *pfStack_13c8;
  fdb_kvs_handle *pfStack_13c0;
  fdb_encryption_key *pfStack_13b8;
  fdb_doc *pfStack_13a8;
  fdb_kvs_handle *pfStack_13a0;
  fdb_kvs_handle *pfStack_1398;
  fdb_file_handle *pfStack_1390;
  fdb_file_handle *pfStack_1388;
  fdb_doc *apfStack_1380 [11];
  fdb_kvs_config fStack_1328;
  timeval tStack_1310;
  fdb_kvs_handle fStack_1300;
  fdb_config fStack_1000;
  fdb_kvs_config *pfStack_f08;
  fdb_file_handle **ppfStack_f00;
  fdb_file_handle **ppfStack_ef8;
  fdb_kvs_handle **ppfStack_ef0;
  char *pcStack_ee8;
  code *pcStack_ee0;
  fdb_file_handle *pfStack_ec8;
  fdb_kvs_handle *pfStack_ec0;
  fdb_kvs_handle *pfStack_eb8;
  fdb_file_handle *pfStack_eb0;
  fdb_doc *apfStack_ea8 [31];
  timeval tStack_db0;
  fdb_kvs_config fStack_da0;
  char acStack_d88 [264];
  fdb_config fStack_c80;
  char acStack_b88 [256];
  char acStack_a88 [264];
  fdb_kvs_handle *pfStack_980;
  fdb_config *pfStack_978;
  fdb_kvs_handle *pfStack_970;
  fdb_kvs_handle *pfStack_968;
  fdb_kvs_handle **ppfStack_960;
  code *pcStack_958;
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  undefined1 auStack_938 [32];
  undefined1 auStack_918 [280];
  char acStack_800 [264];
  fdb_config fStack_6f8;
  fdb_config fStack_600;
  fdb_kvs_handle *pfStack_4f8;
  fdb_config *pfStack_4f0;
  fdb_kvs_handle *pfStack_4e8;
  fdb_doc *pfStack_4e0;
  fdb_doc **ppfStack_4d8;
  code *pcStack_4d0;
  fdb_doc *local_4c0;
  fdb_kvs_handle *local_4b8;
  fdb_doc *local_4b0;
  fdb_doc *apfStack_4a8 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_480;
  timeval local_450;
  fdb_doc local_440 [3];
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pcStack_4d0 = (code *)0x116ce1;
  gettimeofday(&local_450,(__timezone_ptr_t)0x0);
  pcStack_4d0 = (code *)0x116ce6;
  memleak_start();
  local_4c0 = (fdb_doc *)0x0;
  pcStack_4d0 = (code *)0x116cf7;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  pcStack_4d0 = (code *)0x116d07;
  fdb_get_default_config();
  pfVar5 = local_440;
  pcStack_4d0 = (code *)0x116d17;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.purging_interval = 2;
  local_128.compaction_threshold = '\0';
  ppfVar18 = &local_4b0;
  pcStack_4d0 = (code *)0x116d4c;
  fdb_open((fdb_file_handle **)ppfVar18,"./dummy1",&local_128);
  pfVar7 = (fdb_kvs_handle *)&local_4b8;
  pcStack_4d0 = (code *)0x116d5f;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4b0,(fdb_kvs_handle **)pfVar7,(fdb_kvs_config *)pfVar5);
  pcStack_4d0 = (code *)0x116d75;
  fVar3 = fdb_set_log_callback(local_4b8,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001171e7;
  unaff_R12 = (fdb_config *)0x0;
  uVar11 = 0;
  do {
    pcStack_4d0 = (code *)0x116d9d;
    sprintf(local_228,"key%d",uVar11 & 0xffffffff);
    pcStack_4d0 = (code *)0x116db5;
    sprintf(local_328,"meta%d",uVar11 & 0xffffffff);
    pcStack_4d0 = (code *)0x116dcd;
    sprintf((char *)&local_440[0].size_ondisk,"body%d",uVar11 & 0xffffffff);
    ppfVar18 = (fdb_doc **)((long)apfStack_4a8 + (long)unaff_R12);
    pcStack_4d0 = (code *)0x116ddd;
    unaff_R13 = (fdb_kvs_handle *)strlen(local_228);
    unaff_RBP = local_328;
    pcStack_4d0 = (code *)0x116df0;
    pfVar5 = (fdb_doc *)strlen(unaff_RBP);
    pcStack_4d0 = (code *)0x116e00;
    sVar6 = strlen((char *)&local_440[0].size_ondisk);
    pcStack_4d0 = (code *)0x116e25;
    fdb_doc_create(ppfVar18,local_228,(size_t)unaff_R13,unaff_RBP,(size_t)pfVar5,
                   &local_440[0].size_ondisk,sVar6);
    pcStack_4d0 = (code *)0x116e34;
    fdb_set(local_4b8,apfStack_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    unaff_R12 = (fdb_config *)((long)unaff_R12 + 8);
  } while (uVar11 != 10);
  keylen._0_1_ = *(uint8_t *)local_480;
  keylen._1_1_ = *(uint8_t *)((long)local_480 + 1);
  keylen._2_2_ = *(uint16_t *)((long)local_480 + 2);
  keylen._4_4_ = *(uint32_t *)((long)local_480 + 4);
  pfVar7 = (fdb_kvs_handle *)&local_4c0;
  pcStack_4d0 = (code *)0x116e71;
  fdb_doc_create((fdb_doc **)pfVar7,(btree_kv_ops *)(local_480.seqtrie)->aux,keylen,
                 (local_480.seqtrie)->btree_leaf_kv_ops,(local_480.seqtree)->root_bid,(void *)0x0,0)
  ;
  pcStack_4d0 = (code *)0x116e7e;
  fVar3 = fdb_del(local_4b8,local_4c0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar7 = (fdb_kvs_handle *)&local_4c0;
    pcStack_4d0 = (code *)0x116e93;
    fdb_doc_free(local_4c0);
    local_4c0 = (fdb_doc *)0x0;
    pcStack_4d0 = (code *)0x116ea9;
    fdb_commit((fdb_file_handle *)local_4b0,'\0');
    pcStack_4d0 = (code *)0x116eba;
    fdb_compact((fdb_file_handle *)local_4b0,"./dummy2");
    unaff_RBP = (char *)0x0;
    pfVar15 = pfVar5;
    do {
      pcStack_4d0 = (code *)0x116ee0;
      fdb_doc_create((fdb_doc **)pfVar7,apfStack_4a8[(long)unaff_RBP]->key,
                     apfStack_4a8[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
      pcStack_4d0 = (code *)0x116eef;
      fVar3 = fdb_get(local_4b8,local_4c0);
      pfVar5 = local_4c0;
      if (unaff_RBP != (char *)0x5) {
        if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001171a3:
          pcStack_4d0 = (code *)0x1171a8;
          purge_logically_deleted_doc_test();
          goto LAB_001171a8;
        }
        ppfVar18 = (fdb_doc **)local_4c0->meta;
        pfVar12 = (fdb_kvs_handle *)apfStack_4a8[(long)unaff_RBP];
        unaff_R12 = (fdb_config *)pfVar12->staletree;
        pcStack_4d0 = (code *)0x116f31;
        iVar4 = bcmp(ppfVar18,unaff_R12,local_4c0->metalen);
        unaff_R13 = pfVar7;
        if (iVar4 == 0) {
          ppfVar18 = (fdb_doc **)pfVar5->body;
          unaff_R12 = (fdb_config *)(pfVar12->field_6).seqtree;
          pcStack_4d0 = (code *)0x116f50;
          iVar4 = bcmp(ppfVar18,unaff_R12,pfVar5->bodylen);
          if (iVar4 == 0) goto LAB_00116f61;
LAB_00117198:
          pcStack_4d0 = (code *)0x1171a3;
          purge_logically_deleted_doc_test();
          pfVar15 = pfVar5;
          goto LAB_001171a3;
        }
LAB_001171ad:
        pcStack_4d0 = (code *)0x1171b8;
        purge_logically_deleted_doc_test();
        goto LAB_001171b8;
      }
      if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_001171a8:
        pfVar5 = pfVar15;
        pcStack_4d0 = (code *)0x1171ad;
        purge_logically_deleted_doc_test();
        pfVar12 = pfVar7;
        unaff_R13 = (fdb_kvs_handle *)0x0;
        goto LAB_001171ad;
      }
LAB_00116f61:
      unaff_R13 = (fdb_kvs_handle *)0x0;
      pcStack_4d0 = (code *)0x116f69;
      fdb_doc_free(pfVar5);
      local_4c0 = (fdb_doc *)0x0;
      pcStack_4d0 = (code *)0x116f8e;
      fdb_doc_create((fdb_doc **)pfVar7,apfStack_4a8[(long)unaff_RBP]->key,
                     apfStack_4a8[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
      pcStack_4d0 = (code *)0x116f9d;
      fVar3 = fdb_get_metaonly(local_4b8,local_4c0);
      if (unaff_RBP == (char *)0x5) {
        if ((fVar3 != FDB_RESULT_KEY_NOT_FOUND) && (fVar3 != FDB_RESULT_SUCCESS)) goto LAB_001171e2;
      }
      else if (fVar3 != FDB_RESULT_SUCCESS) {
        pcStack_4d0 = (code *)0x117198;
        purge_logically_deleted_doc_test();
        goto LAB_00117198;
      }
      pcStack_4d0 = (code *)0x116fc3;
      fdb_doc_free(local_4c0);
      local_4c0 = (fdb_doc *)0x0;
      unaff_RBP = unaff_RBP + 1;
      pfVar15 = pfVar5;
    } while (unaff_RBP != (char *)0xa);
    pcStack_4d0 = (code *)0x116fe5;
    puts("wait for 3 seconds..");
    pcStack_4d0 = (code *)0x116fef;
    sleep(3);
    pcStack_4d0 = (code *)0x117000;
    fdb_compact((fdb_file_handle *)local_4b0,"./dummy3");
    pfVar12 = (fdb_kvs_handle *)&local_4c0;
    unaff_RBP = (char *)0x0;
    do {
      unaff_R13 = (fdb_kvs_handle *)0x0;
      pcStack_4d0 = (code *)0x11702e;
      fdb_doc_create((fdb_doc **)pfVar12,apfStack_4a8[(long)unaff_RBP]->key,
                     apfStack_4a8[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
      pcStack_4d0 = (code *)0x11703d;
      fVar3 = fdb_get(local_4b8,local_4c0);
      pfVar15 = local_4c0;
      if (unaff_RBP == (char *)0x5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171bd;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001171b8;
        ppfVar18 = (fdb_doc **)local_4c0->meta;
        unaff_R13 = (fdb_kvs_handle *)apfStack_4a8[(long)unaff_RBP];
        unaff_R12 = (fdb_config *)unaff_R13->staletree;
        pcStack_4d0 = (code *)0x11707c;
        iVar4 = bcmp(ppfVar18,unaff_R12,local_4c0->metalen);
        if (iVar4 != 0) goto LAB_001171c7;
        ppfVar18 = (fdb_doc **)pfVar15->body;
        unaff_R12 = (fdb_config *)(unaff_R13->field_6).seqtree;
        pcStack_4d0 = (code *)0x11709b;
        iVar4 = bcmp(ppfVar18,unaff_R12,pfVar15->bodylen);
        unaff_R13 = (fdb_kvs_handle *)0x0;
        if (iVar4 != 0) goto LAB_001171d7;
      }
      unaff_R13 = (fdb_kvs_handle *)0x0;
      pcStack_4d0 = (code *)0x1170b1;
      fdb_doc_free(pfVar15);
      local_4c0 = (fdb_doc *)0x0;
      pcStack_4d0 = (code *)0x1170d6;
      fdb_doc_create((fdb_doc **)pfVar12,apfStack_4a8[(long)unaff_RBP]->key,
                     apfStack_4a8[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
      pcStack_4d0 = (code *)0x1170e5;
      fVar3 = fdb_get_metaonly(local_4b8,local_4c0);
      if (unaff_RBP == (char *)0x5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171c2;
      }
      else if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001171d2;
      pcStack_4d0 = (code *)0x117107;
      fdb_doc_free(local_4c0);
      local_4c0 = (fdb_doc *)0x0;
      unaff_RBP = unaff_RBP + 1;
      pfVar5 = pfVar15;
      if (unaff_RBP == (char *)0xa) {
        pcStack_4d0 = (code *)0x117127;
        fdb_kvs_close(local_4b8);
        pcStack_4d0 = (code *)0x117131;
        fdb_close((fdb_file_handle *)local_4b0);
        lVar13 = 0;
        do {
          pcStack_4d0 = (code *)0x11713d;
          fdb_doc_free(apfStack_4a8[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 10);
        pcStack_4d0 = (code *)0x11714b;
        fdb_shutdown();
        pcStack_4d0 = (code *)0x117150;
        memleak_end();
        pcVar19 = "%s PASSED\n";
        if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        pcStack_4d0 = (code *)0x117181;
        fprintf(_stderr,pcVar19,"purge logically deleted doc test");
        return;
      }
    } while( true );
  }
  goto LAB_001171ec;
LAB_001174ec:
  pcStack_958 = (code *)0x1174fc;
  api_wrapper_test();
LAB_001174fc:
  pcStack_958 = (code *)0x117501;
  api_wrapper_test();
LAB_00117501:
  pfVar12 = (fdb_kvs_handle *)(auStack_918 + 0x18);
  pcStack_958 = (code *)0x117506;
  api_wrapper_test();
  goto LAB_00117506;
LAB_00118042:
  pfStack_13b8 = (fdb_encryption_key *)0x118052;
  flush_before_commit_multi_writers_test();
  pfVar15 = pfVar5;
  goto LAB_00118052;
LAB_00118398:
  pfStack_1730 = (fdb_encryption_key *)0x1183a5;
  auto_commit_test();
  pfVar12 = (fdb_kvs_handle *)pcVar19;
LAB_001183a5:
  pcVar19 = (char *)pfVar12;
  pfStack_1730 = (fdb_encryption_key *)0x1183aa;
  auto_commit_test();
LAB_001183aa:
  pfStack_1730 = (fdb_encryption_key *)0x1183b7;
  auto_commit_test();
  pfVar12 = (fdb_kvs_handle *)pcVar19;
LAB_001183b7:
  pfVar5 = afStack_15d8;
  ppfVar10 = apfStack_16d8;
  pfStack_1730 = (fdb_encryption_key *)0x1183bc;
  auto_commit_test();
  goto LAB_001183bc;
LAB_0011968a:
  pfStack_1c680 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1c680 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1c680 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1c680 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar7 = (fdb_kvs_handle *)pcVar20;
LAB_0011969e:
  pfStack_1c680 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1c680 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1c680 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1c680 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1c680 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
LAB_001171b8:
  pcStack_4d0 = (code *)0x1171bd;
  purge_logically_deleted_doc_test();
LAB_001171bd:
  pfVar15 = pfVar5;
  pcStack_4d0 = (code *)0x1171c2;
  purge_logically_deleted_doc_test();
LAB_001171c2:
  pcStack_4d0 = (code *)0x1171c7;
  purge_logically_deleted_doc_test();
LAB_001171c7:
  pcStack_4d0 = (code *)0x1171d2;
  purge_logically_deleted_doc_test();
LAB_001171d2:
  pcStack_4d0 = (code *)0x1171d7;
  purge_logically_deleted_doc_test();
LAB_001171d7:
  pcStack_4d0 = (code *)0x1171e2;
  purge_logically_deleted_doc_test();
  pfVar7 = pfVar12;
  pfVar5 = pfVar15;
LAB_001171e2:
  pcStack_4d0 = (code *)0x1171e7;
  purge_logically_deleted_doc_test();
LAB_001171e7:
  pcStack_4d0 = (code *)0x1171ec;
  purge_logically_deleted_doc_test();
LAB_001171ec:
  pcStack_4d0 = api_wrapper_test;
  purge_logically_deleted_doc_test();
  pcStack_958 = (code *)0x11720e;
  pfStack_4f8 = pfVar7;
  pfStack_4f0 = unaff_R12;
  pfStack_4e8 = unaff_R13;
  pfStack_4e0 = pfVar5;
  ppfStack_4d8 = ppfVar18;
  pcStack_4d0 = (code *)unaff_RBP;
  gettimeofday((timeval *)(auStack_938 + 0x10),(__timezone_ptr_t)0x0);
  pcStack_958 = (code *)0x117213;
  memleak_start();
  pcStack_958 = (code *)0x11721f;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_958 = (code *)0x11722f;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_918;
  pcStack_958 = (code *)0x11723c;
  fdb_get_default_kvs_config();
  fStack_6f8.buffercache_size = 0;
  fStack_6f8.wal_threshold = 0x400;
  fStack_6f8.flags = 1;
  fStack_6f8.purging_interval = 0;
  fStack_6f8.compaction_threshold = '\0';
  pcVar19 = auStack_938 + 8;
  pcStack_958 = (code *)0x117275;
  fdb_open((fdb_file_handle **)pcVar19,"./dummy1",&fStack_6f8);
  pfVar7 = (fdb_kvs_handle *)&pfStack_948;
  pcStack_958 = (code *)0x117288;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_938._8_8_,(fdb_kvs_handle **)pfVar7,
             (fdb_kvs_config *)pfVar12);
  pcStack_958 = (code *)0x11729e;
  fVar3 = fdb_set_log_callback(pfStack_948,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_958 = (code *)0x1172b9;
    fVar3 = fdb_set_kv(pfStack_948,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011750b;
    pcVar20 = auStack_918 + 0x18;
    pcVar19 = "body%d";
    unaff_R12 = &fStack_6f8 + 1;
    unaff_RBP = (char *)0x0;
    do {
      pcStack_958 = (code *)0x1172eb;
      sprintf(pcVar20,"key%d",unaff_RBP);
      pcStack_958 = (code *)0x1172fa;
      sprintf((char *)unaff_R12,"body%d",unaff_RBP);
      unaff_R13 = pfStack_948;
      pcStack_958 = (code *)0x117307;
      pfVar7 = (fdb_kvs_handle *)strlen(pcVar20);
      pcStack_958 = (code *)0x117312;
      sVar6 = strlen((char *)unaff_R12);
      pcStack_958 = (code *)0x117326;
      fVar3 = fdb_set_kv(unaff_R13,pcVar20,(size_t)pfVar7,unaff_R12,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcStack_958 = (code *)0x1174ec;
        api_wrapper_test();
        goto LAB_001174ec;
      }
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (char *)(ulong)uVar16;
    } while (uVar16 != 10);
    pfVar7 = (fdb_kvs_handle *)(auStack_918 + 0x18);
    pcStack_958 = (code *)0x117350;
    sprintf((char *)pfVar7,"key%d",5);
    pfVar12 = pfStack_948;
    pcStack_958 = (code *)0x11735d;
    sVar6 = strlen((char *)pfVar7);
    pcStack_958 = (code *)0x11736b;
    fVar3 = fdb_del_kv(pfVar12,pfVar7,sVar6);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117510;
    pcStack_958 = (code *)0x117381;
    fVar3 = fdb_del_kv(pfStack_948,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00117515;
    pfVar12 = (fdb_kvs_handle *)(auStack_918 + 0x18);
    pcVar19 = (char *)&pfStack_940;
    unaff_R12 = (fdb_config *)auStack_938;
    unaff_RBP = acStack_800;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_958 = (code *)0x1173b8;
      sprintf((char *)pfVar12,"key%d",unaff_R13);
      pfVar7 = pfStack_948;
      pcStack_958 = (code *)0x1173c5;
      sVar6 = strlen((char *)pfVar12);
      pcStack_958 = (code *)0x1173d9;
      fVar3 = fdb_get_kv(pfVar7,pfVar12,sVar6,(void **)pcVar19,(size_t *)unaff_R12);
      if ((int)unaff_R13 == 5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00117501;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001174fc;
        pcStack_958 = (code *)0x117405;
        sprintf(unaff_RBP,"body%d",unaff_R13);
        pfVar7 = pfStack_940;
        pcStack_958 = (code *)0x11741a;
        iVar4 = bcmp(pfStack_940,unaff_RBP,auStack_938._0_8_);
        if (iVar4 != 0) goto LAB_001174ec;
        pcStack_958 = (code *)0x11742a;
        fdb_free_block(pfVar7);
      }
      uVar16 = (int)unaff_R13 + 1;
      unaff_R13 = (fdb_kvs_handle *)(ulong)uVar16;
    } while (uVar16 != 10);
    pcStack_958 = (code *)0x11744f;
    fVar3 = fdb_get_kv(pfStack_948,(void *)0x0,0,&pfStack_940,(size_t *)auStack_938);
    handle = pfStack_948;
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011751a;
    pfVar12 = (fdb_kvs_handle *)(auStack_918 + 0x18);
    pcStack_958 = (code *)0x11746a;
    sVar6 = strlen((char *)pfVar12);
    pcStack_958 = (code *)0x11747d;
    fVar3 = fdb_get_kv(handle,pfVar12,sVar6,(void **)0x0,(size_t *)0x0);
    if (fVar3 == FDB_RESULT_INVALID_ARGS) {
      pcStack_958 = (code *)0x117490;
      fdb_kvs_close(pfStack_948);
      pcStack_958 = (code *)0x11749a;
      fdb_close((fdb_file_handle *)auStack_938._8_8_);
      pcStack_958 = (code *)0x11749f;
      fdb_shutdown();
      pcStack_958 = (code *)0x1174a4;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_958 = (code *)0x1174d5;
      fprintf(_stderr,pcVar19,"API wrapper test");
      return;
    }
  }
  else {
LAB_00117506:
    pcStack_958 = (code *)0x11750b;
    api_wrapper_test();
LAB_0011750b:
    pcStack_958 = (code *)0x117510;
    api_wrapper_test();
LAB_00117510:
    pcStack_958 = (code *)0x117515;
    api_wrapper_test();
LAB_00117515:
    pcStack_958 = (code *)0x11751a;
    api_wrapper_test();
LAB_0011751a:
    handle = pfVar7;
    pcStack_958 = (code *)0x11751f;
    api_wrapper_test();
  }
  pcStack_958 = flush_before_commit_test;
  api_wrapper_test();
  pcStack_ee0 = (code *)0x117544;
  pfStack_980 = handle;
  pfStack_978 = unaff_R12;
  pfStack_970 = unaff_R13;
  pfStack_968 = pfVar12;
  ppfStack_960 = (fdb_kvs_handle **)pcVar19;
  pcStack_958 = (code *)unaff_RBP;
  gettimeofday(&tStack_db0,(__timezone_ptr_t)0x0);
  pcStack_ee0 = (code *)0x117549;
  memleak_start();
  pcStack_ee0 = (code *)0x117555;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_ee0 = (code *)0x117565;
  fdb_get_default_config();
  pcStack_ee0 = (code *)0x117575;
  fdb_get_default_kvs_config();
  fStack_c80.buffercache_size = 0;
  fStack_c80.wal_threshold = 5;
  fStack_c80.flags = 1;
  fStack_c80.purging_interval = 0;
  fStack_c80.compaction_threshold = '\0';
  fStack_c80.wal_flush_before_commit = true;
  pcStack_ee0 = (code *)0x1175b9;
  fdb_open(&pfStack_eb0,"dummy1",&fStack_c80);
  pcStack_ee0 = (code *)0x1175cc;
  fdb_open(&pfStack_ec8,"dummy1",&fStack_c80);
  pcStack_ee0 = (code *)0x1175dd;
  fdb_kvs_open_default(pfStack_eb0,&pfStack_eb8,&fStack_da0);
  pcStack_ee0 = (code *)0x1175f1;
  fdb_kvs_open_default(pfStack_ec8,&pfStack_ec0,&fStack_da0);
  pcStack_ee0 = (code *)0x117607;
  fVar3 = fdb_set_log_callback(pfStack_ec0,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar18 = apfStack_ea8;
    uVar11 = 0;
    do {
      pcStack_ee0 = (code *)0x117633;
      sprintf(acStack_d88,"key%d",uVar11 & 0xffffffff);
      pcStack_ee0 = (code *)0x11764f;
      sprintf(acStack_a88,"meta%d",uVar11 & 0xffffffff);
      pcStack_ee0 = (code *)0x11766b;
      sprintf(acStack_b88,"body%d",uVar11 & 0xffffffff);
      pcStack_ee0 = (code *)0x117673;
      sVar6 = strlen(acStack_d88);
      pcStack_ee0 = (code *)0x11767e;
      sVar8 = strlen(acStack_a88);
      pcStack_ee0 = (code *)0x117689;
      sVar9 = strlen(acStack_b88);
      pcStack_ee0 = (code *)0x1176a9;
      fdb_doc_create(ppfVar18,acStack_d88,sVar6,acStack_a88,sVar8,acStack_b88,sVar9);
      uVar11 = uVar11 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar11 != 0x1e);
    pcStack_ee0 = (code *)0x1176c9;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    pcStack_ee0 = (code *)0x1176d8;
    fdb_set(pfStack_eb8,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x1176e7;
    fdb_set(pfStack_eb8,apfStack_ea8[1]);
    lVar13 = 0;
    pcStack_ee0 = (code *)0x1176f5;
    fdb_commit(pfStack_eb0,'\0');
    pcStack_ee0 = (code *)0x117704;
    fdb_set(pfStack_ec0,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x117713;
    fdb_set(pfStack_ec0,apfStack_ea8[1]);
    pcStack_ee0 = (code *)0x11771f;
    fdb_end_transaction(pfStack_ec8,'\0');
    pcStack_ee0 = (code *)0x11772e;
    fdb_commit(pfStack_eb0,'\x01');
    pcStack_ee0 = (code *)0x11773d;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    pcStack_ee0 = (code *)0x11774c;
    fdb_set(pfStack_ec0,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x11775b;
    fdb_set(pfStack_ec0,apfStack_ea8[1]);
    pcStack_ee0 = (code *)0x117767;
    fdb_end_transaction(pfStack_ec8,'\0');
    pcStack_ee0 = (code *)0x117776;
    fdb_set(pfStack_eb8,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x117785;
    fdb_set(pfStack_eb8,apfStack_ea8[1]);
    pcStack_ee0 = (code *)0x117791;
    fdb_commit(pfStack_eb0,'\0');
    pcStack_ee0 = (code *)0x1177a0;
    fdb_commit(pfStack_eb0,'\x01');
    pcStack_ee0 = (code *)0x1177af;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    pcStack_ee0 = (code *)0x1177be;
    fdb_set(pfStack_ec0,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x1177cd;
    fdb_set(pfStack_ec0,apfStack_ea8[1]);
    pcStack_ee0 = (code *)0x1177dc;
    fdb_set(pfStack_eb8,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x1177eb;
    fdb_set(pfStack_eb8,apfStack_ea8[1]);
    pcStack_ee0 = (code *)0x1177f7;
    fdb_commit(pfStack_eb0,'\0');
    pcStack_ee0 = (code *)0x117803;
    fdb_end_transaction(pfStack_ec8,'\0');
    pcStack_ee0 = (code *)0x117812;
    fdb_commit(pfStack_eb0,'\x01');
    pcStack_ee0 = (code *)0x117821;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    pcStack_ee0 = (code *)0x117830;
    fdb_set(pfStack_eb8,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x11783f;
    fdb_set(pfStack_eb8,apfStack_ea8[1]);
    pcStack_ee0 = (code *)0x11784e;
    fdb_set(pfStack_ec0,apfStack_ea8[0]);
    pcStack_ee0 = (code *)0x11785d;
    fdb_set(pfStack_ec0,apfStack_ea8[1]);
    pcStack_ee0 = (code *)0x117869;
    fdb_end_transaction(pfStack_ec8,'\0');
    pcStack_ee0 = (code *)0x117875;
    fdb_commit(pfStack_eb0,'\0');
    pcStack_ee0 = (code *)0x117884;
    fdb_commit(pfStack_eb0,'\x01');
    pcStack_ee0 = (code *)0x117893;
    fdb_begin_transaction(pfStack_ec8,'\x02');
    do {
      pcStack_ee0 = (code *)0x1178a2;
      fdb_set(pfStack_ec0,apfStack_ea8[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 10);
    lVar13 = 0;
    do {
      pcStack_ee0 = (code *)0x1178bf;
      fdb_set(pfStack_eb8,apfStack_ea8[lVar13 + 10]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 10);
    pcStack_ee0 = (code *)0x1178d9;
    fdb_compact(pfStack_eb0,"dummy2");
    lVar13 = 0;
    do {
      pcStack_ee0 = (code *)0x1178ed;
      fdb_set(pfStack_ec0,apfStack_ea8[lVar13 + 0x14]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 5);
    lVar13 = 0;
    pcStack_ee0 = (code *)0x117904;
    fdb_end_transaction(pfStack_ec8,'\0');
    do {
      pcStack_ee0 = (code *)0x117916;
      fdb_set(pfStack_eb8,apfStack_ea8[lVar13 + 0x19]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 5);
    pcStack_ee0 = (code *)0x117929;
    fdb_close(pfStack_eb0);
    pcStack_ee0 = (code *)0x117933;
    fdb_close(pfStack_ec8);
    lVar13 = 0;
    do {
      pcStack_ee0 = (code *)0x11793f;
      fdb_doc_free(apfStack_ea8[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x1e);
    pcStack_ee0 = (code *)0x11794d;
    fdb_shutdown();
    pcStack_ee0 = (code *)0x117952;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pcStack_ee0 = (code *)0x117983;
    fprintf(_stderr,pcVar19,"flush before commit test");
    return;
  }
  pcStack_ee0 = flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_ee8 = "dummy1";
  pfStack_13b8 = (fdb_encryption_key *)0x1179bd;
  pfStack_f08 = &fStack_da0;
  ppfStack_f00 = &pfStack_eb0;
  ppfStack_ef8 = &pfStack_ec8;
  ppfStack_ef0 = &pfStack_ec0;
  pcStack_ee0 = (code *)unaff_RBP;
  gettimeofday(&tStack_1310,(__timezone_ptr_t)0x0);
  pfStack_13b8 = (fdb_encryption_key *)0x1179c2;
  memleak_start();
  pfStack_13a8 = (fdb_doc *)0x0;
  pfStack_13b8 = (fdb_encryption_key *)0x1179d3;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_13b8 = (fdb_encryption_key *)0x1179e3;
  fdb_get_default_config();
  fStack_1000.buffercache_size = 0;
  fStack_1000.wal_threshold = 8;
  fStack_1000.flags = 1;
  fStack_1000.purging_interval = 0;
  fStack_1000.compaction_threshold = '\0';
  fStack_1000.wal_flush_before_commit = true;
  pfStack_13b8 = (fdb_encryption_key *)0x117a15;
  fdb_get_default_kvs_config();
  pfStack_13b8 = (fdb_encryption_key *)0x117a2c;
  fdb_open(&pfStack_1390,"dummy1",&fStack_1000);
  pfStack_13b8 = (fdb_encryption_key *)0x117a3e;
  fdb_kvs_open(pfStack_1390,&pfStack_13a0,(char *)0x0,&fStack_1328);
  lVar13 = 0;
  uVar11 = 0;
  do {
    ppfVar10 = &fStack_1300.bub_ctx.handle;
    pfStack_13b8 = (fdb_encryption_key *)0x117a5e;
    sprintf((char *)ppfVar10,"key%d",uVar11 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117a76;
    sprintf((char *)&fStack_1300.config.encryption_key,"meta%d",uVar11 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117a8e;
    sprintf((char *)&fStack_1300,"body%d",uVar11 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117a9e;
    sVar6 = strlen((char *)ppfVar10);
    pfVar17 = &fStack_1300.config.encryption_key;
    pfStack_13b8 = (fdb_encryption_key *)0x117ab1;
    sVar8 = strlen((char *)pfVar17);
    pfStack_13b8 = (fdb_encryption_key *)0x117ac1;
    sVar9 = strlen((char *)&fStack_1300);
    pfStack_13b8 = (fdb_encryption_key *)0x117ae6;
    fdb_doc_create((fdb_doc **)((long)apfStack_1380 + lVar13),&fStack_1300.bub_ctx.handle,sVar6,
                   pfVar17,sVar8,&fStack_1300,sVar9);
    pfStack_13b8 = (fdb_encryption_key *)0x117af5;
    fdb_set(pfStack_13a0,apfStack_1380[uVar11]);
    uVar11 = uVar11 + 1;
    lVar13 = lVar13 + 8;
  } while (uVar11 != 10);
  pfStack_13b8 = (fdb_encryption_key *)0x117b15;
  fdb_commit(pfStack_1390,'\x01');
  pfStack_13b8 = (fdb_encryption_key *)0x117b31;
  fdb_open(&pfStack_1388,"dummy1",&fStack_1000);
  pfStack_13b8 = (fdb_encryption_key *)0x117b48;
  fdb_kvs_open(pfStack_1388,&pfStack_1398,(char *)0x0,&fStack_1328);
  pfVar17 = &fStack_1300.config.encryption_key;
  lVar13 = 0;
  uVar11 = 0;
  do {
    pfStack_13b8 = (fdb_encryption_key *)0x117b71;
    sprintf((char *)pfVar17,"meta2%d",uVar11 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117b85;
    sprintf((char *)&fStack_1300,"body2%d(db2)",uVar11 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117b95;
    sVar6 = strlen((char *)pfVar17);
    pfStack_13b8 = (fdb_encryption_key *)0x117ba0;
    sVar8 = strlen((char *)&fStack_1300);
    pfStack_13b8 = (fdb_encryption_key *)0x117bb4;
    fdb_doc_update((fdb_doc **)((long)apfStack_1380 + lVar13),pfVar17,sVar6,&fStack_1300,sVar8);
    pfStack_13b8 = (fdb_encryption_key *)0x117bc3;
    fdb_set(pfStack_1398,apfStack_1380[uVar11]);
    uVar11 = uVar11 + 1;
    lVar13 = lVar13 + 8;
  } while (uVar11 != 5);
  uVar11 = 5;
  lVar13 = 0x28;
  pfVar17 = &fStack_1300.config.encryption_key;
  pfVar7 = &fStack_1300;
  do {
    pfStack_13b8 = (fdb_encryption_key *)0x117c05;
    sprintf((char *)pfVar17,"meta2%d",uVar11 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117c14;
    sprintf((char *)pfVar7,"body2%d(db1)",uVar11 & 0xffffffff);
    pfStack_13b8 = (fdb_encryption_key *)0x117c24;
    sVar6 = strlen((char *)pfVar17);
    pfStack_13b8 = (fdb_encryption_key *)0x117c2f;
    sVar8 = strlen((char *)pfVar7);
    pfStack_13b8 = (fdb_encryption_key *)0x117c4a;
    fdb_doc_update((fdb_doc **)((long)apfStack_1380 + lVar13),pfVar17,sVar6,pfVar7,sVar8);
    pfStack_13b8 = (fdb_encryption_key *)0x117c59;
    fdb_set(pfStack_13a0,apfStack_1380[uVar11]);
    uVar11 = uVar11 + 1;
    lVar13 = lVar13 + 8;
  } while (uVar11 != 10);
  ppfVar10 = &fStack_1300.bub_ctx.handle;
  pfVar17 = &fStack_1300.config.encryption_key;
  uVar11 = 0;
  do {
    pcVar19 = "body2%d(db1)";
    pfStack_13b8 = (fdb_encryption_key *)0x117c93;
    sprintf((char *)ppfVar10,"key%d",uVar11);
    pfStack_13b8 = (fdb_encryption_key *)0x117ca6;
    sprintf((char *)pfVar17,"meta2%d",uVar11);
    if ((uint)uVar11 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_13b8 = (fdb_encryption_key *)0x117cc3;
    sprintf((char *)&fStack_1300,pcVar19,uVar11);
    pfStack_13b8 = (fdb_encryption_key *)0x117ccb;
    sVar6 = strlen((char *)ppfVar10);
    pfStack_13b8 = (fdb_encryption_key *)0x117ceb;
    fdb_doc_create(&pfStack_13a8,ppfVar10,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117cfa;
    fVar3 = fdb_get(pfStack_13a0,pfStack_13a8);
    pfVar5 = pfStack_13a8;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00118008:
      pfStack_13b8 = (fdb_encryption_key *)0x11800d;
      flush_before_commit_multi_writers_test();
LAB_0011800d:
      pfStack_13b8 = (fdb_encryption_key *)0x118012;
      flush_before_commit_multi_writers_test();
      pfVar5 = (fdb_doc *)pcVar19;
LAB_00118012:
      pfStack_13b8 = (fdb_encryption_key *)0x118022;
      flush_before_commit_multi_writers_test();
LAB_00118022:
      pfStack_13b8 = (fdb_encryption_key *)0x118032;
      flush_before_commit_multi_writers_test();
LAB_00118032:
      pfStack_13b8 = (fdb_encryption_key *)0x118042;
      flush_before_commit_multi_writers_test();
      goto LAB_00118042;
    }
    pfVar7 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117d1a;
    iVar4 = bcmp(pfVar17,pfVar7,pfStack_13a8->metalen);
    if (iVar4 != 0) {
      pfStack_13b8 = (fdb_encryption_key *)0x118008;
      flush_before_commit_multi_writers_test();
      pcVar19 = (char *)pfVar5;
      goto LAB_00118008;
    }
    pfVar7 = (fdb_kvs_handle *)pfVar5->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117d35;
    iVar4 = bcmp(&fStack_1300,pfVar7,pfVar5->bodylen);
    if (iVar4 != 0) goto LAB_00118012;
    pfStack_13b8 = (fdb_encryption_key *)0x117d45;
    fdb_doc_free(pfVar5);
    pcVar19 = (char *)0x0;
    pfStack_13a8 = (fdb_doc *)0x0;
    pfStack_13b8 = (fdb_encryption_key *)0x117d55;
    sVar6 = strlen((char *)ppfVar10);
    pfStack_13b8 = (fdb_encryption_key *)0x117d71;
    fdb_doc_create(&pfStack_13a8,ppfVar10,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117d80;
    fVar3 = fdb_get(pfStack_1398,pfStack_13a8);
    pfVar5 = pfStack_13a8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011800d;
    pfVar7 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117da0;
    iVar4 = bcmp(pfVar17,pfVar7,pfStack_13a8->metalen);
    if (iVar4 != 0) goto LAB_00118032;
    pfVar7 = (fdb_kvs_handle *)pfVar5->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117dbb;
    iVar4 = bcmp(&fStack_1300,pfVar7,pfVar5->bodylen);
    if (iVar4 != 0) goto LAB_00118022;
    pfStack_13b8 = (fdb_encryption_key *)0x117dcb;
    fdb_doc_free(pfVar5);
    pfStack_13a8 = (fdb_doc *)0x0;
    uVar16 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar16;
  } while (uVar16 != 10);
  pfStack_13b8 = (fdb_encryption_key *)0x117df2;
  fdb_commit(pfStack_1390,'\0');
  pfStack_13b8 = (fdb_encryption_key *)0x117dfe;
  fdb_commit(pfStack_1388,'\0');
  ppfVar10 = &fStack_1300.bub_ctx.handle;
  pfVar17 = &fStack_1300.config.encryption_key;
  uVar11 = 0;
  while( true ) {
    pfStack_13b8 = (fdb_encryption_key *)0x117e32;
    sprintf((char *)ppfVar10,"key%d",uVar11);
    pfStack_13b8 = (fdb_encryption_key *)0x117e45;
    sprintf((char *)pfVar17,"meta2%d",uVar11);
    pcVar19 = "body2%d(db1)";
    if ((uint)uVar11 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_13b8 = (fdb_encryption_key *)0x117e5f;
    sprintf((char *)&fStack_1300,pcVar19,uVar11);
    pfStack_13b8 = (fdb_encryption_key *)0x117e67;
    sVar6 = strlen((char *)ppfVar10);
    pfStack_13b8 = (fdb_encryption_key *)0x117e87;
    fdb_doc_create(&pfStack_13a8,ppfVar10,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117e96;
    fVar3 = fdb_get(pfStack_13a0,pfStack_13a8);
    pfVar5 = pfStack_13a8;
    pfVar15 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar7 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117eb6;
    iVar4 = bcmp(pfVar17,pfVar7,pfStack_13a8->metalen);
    if (iVar4 != 0) goto LAB_00118042;
    pfVar7 = (fdb_kvs_handle *)pfVar5->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117ed1;
    iVar4 = bcmp(&fStack_1300,pfVar7,pfVar5->bodylen);
    if (iVar4 != 0) goto LAB_0011805c;
    pfStack_13b8 = (fdb_encryption_key *)0x117ee1;
    fdb_doc_free(pfVar5);
    pfVar15 = (fdb_doc *)0x0;
    pfStack_13a8 = (fdb_doc *)0x0;
    pfStack_13b8 = (fdb_encryption_key *)0x117ef1;
    sVar6 = strlen((char *)ppfVar10);
    pfStack_13b8 = (fdb_encryption_key *)0x117f0d;
    fdb_doc_create(&pfStack_13a8,ppfVar10,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_13b8 = (fdb_encryption_key *)0x117f1c;
    fVar3 = fdb_get(pfStack_1398,pfStack_13a8);
    pfVar5 = pfStack_13a8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118057;
    pfVar7 = (fdb_kvs_handle *)pfStack_13a8->meta;
    pfStack_13b8 = (fdb_encryption_key *)0x117f3c;
    iVar4 = bcmp(pfVar17,pfVar7,pfStack_13a8->metalen);
    if (iVar4 != 0) goto LAB_0011807c;
    pfVar7 = (fdb_kvs_handle *)pfVar5->body;
    pfStack_13b8 = (fdb_encryption_key *)0x117f57;
    iVar4 = bcmp(&fStack_1300,pfVar7,pfVar5->bodylen);
    if (iVar4 != 0) goto LAB_0011806c;
    pfStack_13b8 = (fdb_encryption_key *)0x117f67;
    fdb_doc_free(pfVar5);
    pfStack_13a8 = (fdb_doc *)0x0;
    uVar16 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar16;
    if (uVar16 == 10) {
      pfStack_13b8 = (fdb_encryption_key *)0x117f8c;
      fdb_close(pfStack_1390);
      pfStack_13b8 = (fdb_encryption_key *)0x117f96;
      fdb_close(pfStack_1388);
      lVar13 = 0;
      do {
        pfStack_13b8 = (fdb_encryption_key *)0x117fa2;
        fdb_doc_free(apfStack_1380[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 10);
      pfStack_13b8 = (fdb_encryption_key *)0x117fb0;
      fdb_shutdown();
      pfStack_13b8 = (fdb_encryption_key *)0x117fb5;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_13b8 = (fdb_encryption_key *)0x117fe6;
      fprintf(_stderr,pcVar19,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00118052:
  pfStack_13b8 = (fdb_encryption_key *)0x118057;
  flush_before_commit_multi_writers_test();
LAB_00118057:
  pfStack_13b8 = (fdb_encryption_key *)0x11805c;
  flush_before_commit_multi_writers_test();
  pfVar5 = pfVar15;
LAB_0011805c:
  pfStack_13b8 = (fdb_encryption_key *)0x11806c;
  flush_before_commit_multi_writers_test();
LAB_0011806c:
  pfStack_13b8 = (fdb_encryption_key *)0x11807c;
  flush_before_commit_multi_writers_test();
LAB_0011807c:
  pfVar12 = &fStack_1300;
  ppfVar10 = &fStack_1300.bub_ctx.handle;
  pfVar17 = &fStack_1300.config.encryption_key;
  pfStack_13b8 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_1730 = (fdb_encryption_key *)0x1180a9;
  uStack_13e0 = uVar11;
  ppfStack_13d8 = ppfVar10;
  pfStack_13d0 = pfVar7;
  pfStack_13c8 = pfVar5;
  pfStack_13c0 = pfVar12;
  pfStack_13b8 = pfVar17;
  gettimeofday((timeval *)(auStack_1708 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_1730 = (fdb_encryption_key *)0x1180ae;
  memleak_start();
  pfStack_1730 = (fdb_encryption_key *)0x1180ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar14 = &fStack_14d8;
  pfStack_1730 = (fdb_encryption_key *)0x1180ca;
  fdb_get_default_config();
  pfStack_1730 = (fdb_encryption_key *)0x1180d4;
  fdb_get_default_kvs_config();
  fStack_14d8.buffercache_size = 0;
  fStack_14d8.wal_threshold = 0x1000;
  fStack_14d8.flags = 1;
  fStack_14d8.durability_opt = '\x02';
  fStack_14d8.auto_commit = true;
  pfStack_1730 = (fdb_encryption_key *)0x118107;
  fVar3 = fdb_open(&pfStack_1718,"dummy1",pfVar14);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1730 = (fdb_encryption_key *)0x118123;
    fVar3 = fdb_kvs_open_default(pfStack_1718,&pfStack_1720,(fdb_kvs_config *)(auStack_1708 + 8));
    pcVar19 = (char *)pfVar12;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c1;
    pcVar19 = "body%d";
    pfVar17 = (fdb_encryption_key *)0x0;
    do {
      pfStack_1730 = (fdb_encryption_key *)0x118154;
      sprintf((char *)afStack_15d8,"key%d",pfVar17);
      pfStack_1730 = (fdb_encryption_key *)0x118163;
      sprintf((char *)apfStack_16d8,"body%d",pfVar17);
      pfVar7 = pfStack_1720;
      pfStack_1730 = (fdb_encryption_key *)0x118170;
      sVar6 = strlen((char *)afStack_15d8);
      pfVar14 = (fdb_config *)(sVar6 + 1);
      pfStack_1730 = (fdb_encryption_key *)0x11817c;
      sVar6 = strlen((char *)apfStack_16d8);
      pfStack_1730 = (fdb_encryption_key *)0x118191;
      fVar3 = fdb_set_kv(pfVar7,afStack_15d8,(size_t)pfVar14,apfStack_16d8,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1730 = (fdb_encryption_key *)0x118398;
        auto_commit_test();
        goto LAB_00118398;
      }
      uVar16 = (int)pfVar17 + 1;
      pfVar17 = (fdb_encryption_key *)(ulong)uVar16;
    } while (uVar16 != 5000);
    pfVar5 = afStack_15d8;
    ppfVar10 = apfStack_16d8;
    pfVar7 = (fdb_kvs_handle *)auStack_1708;
    pfVar17 = (fdb_encryption_key *)auStack_1710;
    pfVar14 = (fdb_config *)0x0;
    do {
      pfStack_1730 = (fdb_encryption_key *)0x1181cf;
      sprintf((char *)pfVar5,"key%d",pfVar14);
      pfStack_1730 = (fdb_encryption_key *)0x1181e2;
      sprintf((char *)ppfVar10,"body%d",pfVar14);
      pfVar12 = pfStack_1720;
      pfStack_1730 = (fdb_encryption_key *)0x1181ef;
      sVar6 = strlen((char *)pfVar5);
      pfStack_1730 = (fdb_encryption_key *)0x118204;
      fVar3 = fdb_get_kv(pfVar12,pfVar5,sVar6 + 1,(void **)pfVar7,(size_t *)pfVar17);
      pcVar19 = (char *)auStack_1708._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183a5;
      pfStack_1730 = (fdb_encryption_key *)0x118221;
      iVar4 = bcmp((void *)auStack_1708._0_8_,ppfVar10,(size_t)auStack_1710);
      if (iVar4 != 0) goto LAB_00118398;
      pfStack_1730 = (fdb_encryption_key *)0x118231;
      fdb_free_block(pcVar19);
      uVar16 = (int)pfVar14 + 1;
      pfVar14 = (fdb_config *)(ulong)uVar16;
    } while (uVar16 != 5000);
    pfStack_1730 = (fdb_encryption_key *)0x118245;
    fVar3 = fdb_kvs_close(pfStack_1720);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c6;
    pfStack_1730 = (fdb_encryption_key *)0x118257;
    fVar3 = fdb_close(pfStack_1718);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183cb;
    pfStack_1730 = (fdb_encryption_key *)0x118278;
    fVar3 = fdb_open(&pfStack_1718,"dummy1",&fStack_14d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d0;
    pfStack_1730 = (fdb_encryption_key *)0x118294;
    fVar3 = fdb_kvs_open_default(pfStack_1718,&pfStack_1720,(fdb_kvs_config *)(auStack_1708 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d5;
    pfVar5 = afStack_15d8;
    ppfVar10 = apfStack_16d8;
    pfVar7 = (fdb_kvs_handle *)auStack_1708;
    pfVar17 = (fdb_encryption_key *)auStack_1710;
    pfVar14 = (fdb_config *)0x0;
    do {
      pfStack_1730 = (fdb_encryption_key *)0x1182c8;
      sprintf((char *)pfVar5,"key%d",pfVar14);
      pfStack_1730 = (fdb_encryption_key *)0x1182db;
      sprintf((char *)ppfVar10,"body%d",pfVar14);
      pfVar12 = pfStack_1720;
      pfStack_1730 = (fdb_encryption_key *)0x1182e8;
      sVar6 = strlen((char *)pfVar5);
      pfStack_1730 = (fdb_encryption_key *)0x1182fd;
      fVar3 = fdb_get_kv(pfVar12,pfVar5,sVar6 + 1,(void **)pfVar7,(size_t *)pfVar17);
      pcVar19 = (char *)auStack_1708._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183b7;
      pfStack_1730 = (fdb_encryption_key *)0x11831a;
      iVar4 = bcmp((void *)auStack_1708._0_8_,ppfVar10,(size_t)auStack_1710);
      if (iVar4 != 0) goto LAB_001183aa;
      pfStack_1730 = (fdb_encryption_key *)0x11832a;
      fdb_free_block(pcVar19);
      uVar16 = (int)pfVar14 + 1;
      pfVar14 = (fdb_config *)(ulong)uVar16;
    } while (uVar16 != 5000);
    pfStack_1730 = (fdb_encryption_key *)0x11833e;
    fVar3 = fdb_close(pfStack_1718);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_1730 = (fdb_encryption_key *)0x11834b;
      fdb_shutdown();
      pfStack_1730 = (fdb_encryption_key *)0x118350;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1730 = (fdb_encryption_key *)0x118381;
      fprintf(_stderr,pcVar19,"auto commit test");
      return;
    }
  }
  else {
LAB_001183bc:
    pfStack_1730 = (fdb_encryption_key *)0x1183c1;
    auto_commit_test();
    pcVar19 = (char *)pfVar12;
LAB_001183c1:
    pfStack_1730 = (fdb_encryption_key *)0x1183c6;
    auto_commit_test();
LAB_001183c6:
    pfStack_1730 = (fdb_encryption_key *)0x1183cb;
    auto_commit_test();
LAB_001183cb:
    pfStack_1730 = (fdb_encryption_key *)0x1183d0;
    auto_commit_test();
LAB_001183d0:
    pfStack_1730 = (fdb_encryption_key *)0x1183d5;
    auto_commit_test();
LAB_001183d5:
    pfStack_1730 = (fdb_encryption_key *)0x1183da;
    auto_commit_test();
  }
  pfStack_1730 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_19a8 = (code *)0x1183fc;
  pfStack_1758 = pfVar14;
  ppfStack_1750 = ppfVar10;
  pfStack_1748 = pfVar7;
  pfStack_1740 = pfVar5;
  pfStack_1738 = (fdb_kvs_handle *)pcVar19;
  pfStack_1730 = pfVar17;
  gettimeofday(&tStack_1958,(__timezone_ptr_t)0x0);
  pcStack_19a8 = (code *)0x118401;
  memleak_start();
  pcStack_19a8 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_19a8 = (code *)0x11841d;
  fdb_get_default_config();
  fStack_1850.buffercache_size = 0;
  fStack_1850.auto_commit = true;
  pcStack_19a8 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_19a8 = (code *)0x118446;
  memcpy(&fStack_1850,afStack_1948,0xf8);
  pcStack_19a8 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar11 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_1990 + 8,"est1",5);
    builtin_strncpy(acStack_1990,"./func_t",8);
    pcStack_19a8 = (code *)0x11849b;
    fVar3 = fdb_open(&pfStack_19a0,acStack_1990,&fStack_1850);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_19a8 = (code *)0x1184b7;
    fVar3 = fdb_kvs_open(pfStack_19a0,&pfStack_1998,"justonekv",&fStack_1970);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_19a8 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_19a8 = (code *)0x1184cd;
    fVar3 = fdb_get_file_info(pfStack_19a0,afStack_1948);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (afStack_1948[0].file_size != fStack_1850.blocksize * 7) {
      pcStack_19a8 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_19a8 = (code *)0x1184f8;
    fVar3 = fdb_close(pfStack_19a0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar16 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar16;
    if (uVar16 == 0) {
      pcStack_19a8 = (code *)0x118523;
      fdb_shutdown();
      pcStack_19a8 = (code *)0x118528;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_19a8 = (code *)0x118559;
      fprintf(_stderr,pcVar19,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_19a8 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_19a8 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_19a8 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_19b0 = 0x745f636e75662f2e;
  pcStack_19c0 = "justonekv";
  ppfStack_1f40 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_19d0 = &pfStack_1998;
  pcStack_19c8 = acStack_1990;
  uStack_19b8 = uVar11;
  pcStack_19a8 = (code *)&pfStack_19a0;
  gettimeofday(&tStack_1de0,(__timezone_ptr_t)0x0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_1f28 = (fdb_doc *)0x0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_1f40 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_1f40 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_1dd0.buffercache_size = 0;
  fStack_1dd0.flags = 1;
  fStack_1dd0.purging_interval = 0;
  fStack_1dd0.compaction_threshold = '\0';
  ppfStack_1f40 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
             &fStack_1ef0);
  ppfVar18 = apfStack_1ed8;
  uVar11 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_1cd8,"key%d",uVar11 & 0xffffffff);
    ppfStack_1f40 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_1ad8,"meta%d",uVar11 & 0xffffffff);
    ptr_fhandle = apfStack_1bd8;
    ppfStack_1f40 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar11 & 0xffffffff);
    ppfStack_1f40 = (fdb_kvs_handle **)0x1186a1;
    ppfVar10 = (fdb_kvs_handle **)strlen(acStack_1cd8);
    ppfStack_1f40 = (fdb_kvs_handle **)0x1186ac;
    sVar6 = strlen(acStack_1ad8);
    ppfStack_1f40 = (fdb_kvs_handle **)0x1186b7;
    sVar8 = strlen((char *)ptr_fhandle);
    ppfStack_1f40 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar18,acStack_1cd8,(size_t)ppfVar10,acStack_1ad8,sVar6,ptr_fhandle,sVar8);
    uVar11 = uVar11 + 1;
    ppfVar18 = ppfVar18 + 1;
  } while (uVar11 != 0x1e);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_1f20,apfStack_1ed8[0]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_1f20,apfStack_1ed8[1]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  lVar13 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[lVar13 + 2]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar14 = &fStack_1dd0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",pfVar14);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",pfVar14);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
             &fStack_1ef0);
  uVar11 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar11]->key,apfStack_1ed8[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if (uVar11 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_1f40 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  lVar13 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[lVar13 + 2]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  lVar13 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_1f20,apfStack_1ed8[lVar13 + 4]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar14 = &fStack_1dd0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",pfVar14);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",pfVar14);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
             &fStack_1ef0);
  uVar11 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar11]->key,apfStack_1ed8[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if ((uVar11 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_1f40 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_1f40 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 6);
  lVar13 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_1f20,apfStack_1ed8[lVar13 + 4]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  lVar13 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[lVar13 + 6]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_1f00,"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_1f00,&pfStack_1ef8,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_1f00,'\x02');
  lVar13 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_1ef8,apfStack_1ed8[lVar13 + 8]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  ppfStack_1f40 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_1f00,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_1f00);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,&pfStack_1f20,&fStack_1ef0);
  uVar11 = 0;
  do {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar11]->key,apfStack_1ed8[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if ((int)uVar11 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_1f40 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 10);
  pfVar14 = (fdb_config *)auStack_1f18;
  ppfStack_1f40 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar14,"dummy1",&fStack_1dd0);
  ptr_fhandle = &pfStack_1f00;
  ppfStack_1f40 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_1dd0);
  ptr_handle_00 = (fdb_kvs_handle **)(auStack_1f18 + 8);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._0_8_,ptr_handle_00,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_1f00,&pfStack_1ef8,&fStack_1ef0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
  ppfVar10 = &pfStack_1f20;
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_1f20,apfStack_1ed8[10]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_1f20,apfStack_1ed8[0xb]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[0xc]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[0xd]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_1f00,'\x02');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_1ef8,apfStack_1ed8[0xe]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_1ef8,apfStack_1ed8[0xf]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_1f20,apfStack_1ed8[0x10]);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_1f00,'\x01');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_1f20,apfStack_1ed8[0x11]);
  uVar11 = 0;
  ppfStack_1f40 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_1f18._16_8_,'\0');
  ppfStack_1f40 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_1f00);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_1f18 + 0x10),"dummy1",&fStack_1dd0);
  ppfStack_1f40 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1f18._16_8_,ppfVar10,&fStack_1ef0);
  while( true ) {
    ppfStack_1f40 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_1f28,apfStack_1ed8[uVar11 + 10]->key,apfStack_1ed8[uVar11 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1f40 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(pfStack_1f20,pfStack_1f28);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_1f40 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_1f28);
    pfStack_1f28 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
    if (uVar11 == 8) {
      ppfStack_1f40 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_1f18,"dummy1",&fStack_1dd0);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_1f18._0_8_,(fdb_kvs_handle **)(auStack_1f18 + 8),
                 &fStack_1ef0);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x02');
      ppfStack_1f40 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_1f18._8_8_,apfStack_1ed8[0x14]);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_1f18._16_8_,"dummy2");
      ppfStack_1f40 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_1f18._0_8_,'\x01');
      ppfStack_1f40 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_1f18._16_8_);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_1f18._0_8_);
      lVar13 = 0;
      do {
        ppfStack_1f40 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_1ed8[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x1e);
      ppfStack_1f40 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_1f40 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      ppfStack_1f40 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar19,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_1f40 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_1f40 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_18188 = (fdb_doc *)0x118dba;
  ppfStack_1f68 = &pfStack_1f28;
  pfStack_1f60 = pfVar14;
  ppfStack_1f58 = ptr_fhandle;
  uStack_1f50 = uVar11;
  ppfStack_1f48 = ptr_handle_00;
  ppfStack_1f40 = ppfVar10;
  gettimeofday(&tStack_18120,(__timezone_ptr_t)0x0);
  pfStack_18188 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_18170 = (fdb_doc *)0x0;
  pfStack_18188 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_18188 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_18188 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_17ea8.flags = 1;
  fStack_17ea8.purging_interval = 0;
  fStack_17ea8.compaction_threshold = '\0';
  fStack_17ea8.durability_opt = '\x02';
  pfStack_18188 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_18168,"dummy1",&fStack_17ea8);
  pfStack_18188 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_18168,&pfStack_18158,&fStack_18110);
  ppfVar18 = apfStack_17cb0;
  pfVar5 = afStack_180b0;
  pfVar15 = (fdb_doc *)0x0;
  lVar13 = 0;
  do {
    sVar6 = 0xff7f;
    if (lVar13 == 1) {
      sVar6 = 0x1fff;
    }
    if (lVar13 == 0) {
      sVar6 = 0x7fff;
    }
    pfStack_18188 = (fdb_doc *)0x118e7c;
    lStack_18150 = lVar13;
    memset(asStack_11ef0,0x5f,sVar6);
    *(undefined1 *)((long)asStack_11ef0 + sVar6) = 0;
    lVar13 = 0;
    doc_01 = ppfVar18;
    lStack_18148 = (long)pfVar15;
    ppfStack_18140 = ppfVar18;
    sStack_18128 = sVar6;
    do {
      pfStack_18188 = (fdb_doc *)0x118eb2;
      lStack_18138 = lVar13;
      sprintf((char *)pfVar5,"%08d");
      asStack_11ef0[0] = afStack_180b0[0].keylen;
      uVar11 = 0;
      lStack_18160 = (long)pfVar15;
      ppfStack_18130 = doc_01;
      do {
        pfStack_18188 = (fdb_doc *)0x118eee;
        sprintf((char *)pfVar5,"%08d",uVar11 & 0xffffffff);
        *(size_t *)((long)apfStack_17cb0 + sStack_18128 + 0x5db8) = afStack_180b0[0].keylen;
        uVar16 = (int)lStack_18160 + (int)uVar11;
        pfStack_18188 = (fdb_doc *)0x118f27;
        sprintf(acStack_17db0,"meta%d",(ulong)uVar16);
        pfStack_18188 = (fdb_doc *)0x118f3a;
        sprintf(acStack_17fb0,"body%d",(ulong)uVar16);
        pfStack_18188 = (fdb_doc *)0x118f47;
        sVar6 = strlen((char *)asStack_11ef0);
        pfStack_18188 = (fdb_doc *)0x118f53;
        sVar8 = strlen(acStack_17db0);
        pfStack_18188 = (fdb_doc *)0x118f67;
        sVar9 = strlen(acStack_17fb0);
        lVar1 = lStack_18160;
        pcVar19 = acStack_17fb0;
        pfStack_18188 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_01,asStack_11ef0,sVar6 + 1,acStack_17db0,sVar8 + 1,pcVar19,sVar9 + 1);
        uVar11 = uVar11 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar11 != 10);
      lVar13 = lStack_18138 + 1;
      doc_01 = ppfStack_18130 + 10;
      pfVar15 = (fdb_doc *)(lVar1 + 10);
    } while (lVar13 != 100);
    lVar13 = lStack_18150 + 1;
    ppfVar18 = ppfStack_18140 + 1000;
    pfVar15 = (fdb_doc *)(lStack_18148 + 1000);
  } while (lVar13 != 3);
  lVar13 = 0;
  do {
    pfStack_18188 = (fdb_doc *)0x119010;
    fdb_set(pfStack_18158,apfStack_17cb0[lVar13]);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3000);
  pfStack_18188 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_18168,'\x01');
  pfStack_18188 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_18168,&fStack_180f8);
  if (fStack_180f8.doc_count != 3000) {
    pfStack_18188 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar13 = 0;
  while( true ) {
    pfStack_18188 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_18170,apfStack_17cb0[lVar13]->key,apfStack_17cb0[lVar13]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_18188 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_18158,pfStack_18170);
    doc = pfStack_18170;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_18170->key;
    pfVar5 = apfStack_17cb0[lVar13];
    pcVar19 = (char *)pfVar5->key;
    pfStack_18188 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_01,pcVar19,pfStack_18170->keylen);
    pfVar15 = doc;
    if (iVar4 != 0) {
      pfStack_18188 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar19 = (char *)pfVar5->meta;
    pfStack_18188 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_01,pcVar19,doc->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_01 = (fdb_doc **)doc->body;
    pcVar19 = (char *)pfVar5->body;
    pfStack_18188 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_01,pcVar19,doc->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_18188 = (fdb_doc *)0x11910e;
    fdb_doc_free(doc);
    pfStack_18170 = (fdb_doc *)0x0;
    lVar13 = lVar13 + 1;
    if (lVar13 == 3000) {
      pfStack_18188 = (fdb_doc *)0x119131;
      fdb_close(pfStack_18168);
      lVar13 = 0;
      do {
        pfStack_18188 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_17cb0[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3000);
      pfStack_18188 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_18188 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_18188 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar19,"long key test");
      return;
    }
  }
  pfStack_18188 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_18188 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_18188 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1c680 = (fdb_kvs_handle *)0x1191df;
  ppfStack_181b0 = &pfStack_18170;
  pcStack_181a8 = pcVar19;
  lStack_181a0 = lVar13;
  pfStack_18198 = pfVar15;
  ppfStack_18190 = doc_01;
  pfStack_18188 = pfVar5;
  gettimeofday((timeval *)(auStack_1c5f8 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1c680 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1c680 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1c680 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1c680 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1c4b0.wal_threshold = 0x400;
  fStack_1c4b0.compaction_mode = '\0';
  fStack_1c4b0.durability_opt = '\x02';
  pcVar20 = (char *)&fStack_1c1b8;
  doc_00 = apfStack_1c3b8;
  pcVar19 = "kvs%d";
  uVar11 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc_00,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle = (char *)(apfStack_1c638 + (long)ptr_iterator);
    pfStack_1c680 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)doc_00,&fStack_1c4b0);
    pfVar7 = (fdb_kvs_handle *)pcVar20;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1c660 = ptr_iterator;
    pfStack_1c658 = (fdb_kvs_handle *)pcVar20;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1c680 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc_00,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar11));
      pfStack_1c680 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)pcVar20,(char *)doc_00,&fStack_1c650);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1c680 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      pcVar20 = (char *)&(((fdb_kvs_handle *)pcVar20)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1c660 + 1);
    uVar11 = uVar11 + 0x80;
    pcVar20 = (char *)&pfStack_1c658[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1c5b8;
  doc_00 = apfStack_1c2b8;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    uVar11 = 0;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar11);
      pfStack_1c680 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc_00,"value%08d",uVar11);
      pcVar19 = *(char **)(&fStack_1c1b8.kvs_config.create_if_missing + (long)pfVar7 * 8);
      pfStack_1c680 = (fdb_kvs_handle *)0x119323;
      sVar6 = strlen((char *)ptr_iterator);
      ptr_handle = (char *)(sVar6 + 1);
      pfStack_1c680 = (fdb_kvs_handle *)0x11932f;
      sVar6 = strlen((char *)doc_00);
      pfStack_1c680 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar19,ptr_iterator,(size_t)ptr_handle,doc_00,sVar6 + 1)
      ;
      pcVar20 = (char *)pfVar7;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar16 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar16;
    } while (uVar16 != 10);
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
  } while (pfVar7 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1c680 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c638[(long)ptr_handle],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1c680 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c638[(long)ptr_handle],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  doc_00 = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_1a1b8;
  ptr_iterator = (fdb_iterator **)(auStack_1c5f8 + 8);
  pfVar7 = (fdb_kvs_handle *)auStack_1c5f8;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1bdb8[(long)doc_00],(fdb_kvs_info *)pfVar7);
    if ((fdb_custom_cmp_variable)auStack_1c5f8._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1c680 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1c680 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1bdb8[(long)doc_00],
                              (fdb_kvs_handle **)ptr_handle,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc_00 = doc_00 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (doc_00 < (fdb_iterator **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1c638[(long)ptr_handle],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1c668;
  pfStack_1c668 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1c670;
  pcVar20 = "key%08d";
  doc_00 = apfStack_1c5b8;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_1a1b8[(long)pfVar7],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar11 = 0;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1c670,(fdb_doc **)ptr_handle);
      pcVar19 = (char *)pfVar7;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1c680 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc_00,"key%08d",uVar11);
      pfStack_1c680 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc_00,(char *)pfStack_1c668->op_stats);
      if (iVar4 != 0) {
        pfStack_1c680 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      pfStack_1c680 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1c670);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c680 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1c670);
    pcVar19 = (char *)&(pfVar7->config).wal_threshold;
    bVar21 = pfVar7 < (fdb_kvs_handle *)0x380;
    pfVar7 = (fdb_kvs_handle *)pcVar19;
  } while (bVar21);
  pfStack_1c680 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1c668);
  ptr_handle = "key%08d";
  ptr_iterator = apfStack_1c5b8;
  doc_00 = (fdb_iterator **)0x0;
  do {
    uVar11 = 0;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar11);
      pcVar20 = *(char **)(&fStack_1c1b8.kvs_config.create_if_missing + (long)doc_00 * 8);
      pfStack_1c680 = (fdb_kvs_handle *)0x119529;
      sVar6 = strlen((char *)ptr_iterator);
      pfStack_1c680 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar20,ptr_iterator,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar16 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar16;
    } while (uVar16 != 10);
    doc_00 = (fdb_iterator **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_iterator **)0x400);
  ptr_handle = "dummy_compact%d";
  ptr_iterator = apfStack_1c3b8;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar7 & 0xffffffff);
    pfStack_1c680 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1c638[(long)pfVar7],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
  } while (pfVar7 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1c668;
  pfStack_1c668 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1c670;
  pcVar20 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1c680 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1c1b8.kvs_config.create_if_missing + (long)pcVar20 * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar7 = (fdb_kvs_handle *)pcVar20;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1c680 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1c670,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1c680 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1c670);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c680 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1c670);
    pfVar7 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar20)->config).wal_threshold;
    bVar21 = pcVar20 < (fdb_kvs_handle *)0x380;
    pcVar20 = (char *)pfVar7;
  } while (bVar21);
  pfStack_1c680 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1c668);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1c680 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1c638[(long)ptr_handle]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1c680 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1c680 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1c680 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar19,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1c680 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1c680 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1c680 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1c9f8 = (code *)0x1196e0;
  ppfStack_1c698 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1c690 = doc_00;
  ppfStack_1c688 = ptr_iterator;
  pfStack_1c680 = pfVar7;
  gettimeofday(&tStack_1c9a8,(__timezone_ptr_t)0x0);
  pcStack_1c9f8 = (code *)0x1196e5;
  memleak_start();
  pcStack_1c9f8 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar14 = &fStack_1c998;
  pcStack_1c9f8 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1c9f8 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1c9f8 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1c9d8,"./dummy1",pfVar14);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1c9f8 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1c9d8,&pfStack_1c9d0,"db",&fStack_1c9c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1c9f8 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1c9d8,&pfStack_1c9c8,"db2",&fStack_1c9c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar14 = &fStack_1c7a0;
    pcStack_1c9f8 = (code *)0x119785;
    sprintf((char *)pfVar14,"key%d",0);
    ptr_iterator = apfStack_1c8a0;
    pcStack_1c9f8 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1c9f8 = (code *)0x1197a8;
    pfVar7 = (fdb_kvs_handle *)strlen((char *)pfVar14);
    pcStack_1c9f8 = (code *)0x1197b3;
    sVar6 = strlen((char *)ptr_iterator);
    doc_00 = &pfStack_1c9e0;
    pcStack_1c9f8 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc_00,pfVar14,(size_t)pfVar7,(void *)0x0,0,ptr_iterator,sVar6 + 1);
    pcStack_1c9f8 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1c9d0,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1c9f8 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1c9d8,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1c9f8 = (code *)0x11981b;
    sprintf((char *)pfStack_1c9e0->tree_cursor_prev,"bOdy%d",0);
    pcStack_1c9f8 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1c9c8,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1c9f8 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1c9d8,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1c9f8 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1c9d0,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1c9f8 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1c9c8,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1c9f8 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1c9d0,(fdb_doc *)pfStack_1c9e0);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1c9f8 = (code *)0x119899;
      fdb_close(pfStack_1c9d8);
      pcStack_1c9f8 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1c9e0);
      pcStack_1c9f8 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1c9f8 = (code *)0x1198ad;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_1c9f8 = (code *)0x1198de;
      fprintf(_stderr,pcVar19,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1c9f8 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1c9f8 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1c9f8 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1c9f8 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1c9f8 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1c9f8 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1c9f8 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1c9f8 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1c9f8 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1c9f8 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1ca20 = pfVar14;
  ppfStack_1ca18 = doc_00;
  pfStack_1ca10 = (fdb_kvs_handle *)pcVar19;
  ppfStack_1ca08 = ptr_iterator;
  pfStack_1ca00 = pfVar7;
  pcStack_1c9f8 = (code *)uVar11;
  gettimeofday(&tStack_1ce30,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1ce20.wal_threshold = 0x400;
  fStack_1ce20.flags = 1;
  fStack_1ce20.purging_interval = 0;
  fStack_1ce20.compaction_threshold = '\0';
  fStack_1ce20.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1ce20.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1ce88,"./dummy1",&fStack_1ce20);
  fdb_kvs_open_default(pfStack_1ce88,&pfStack_1ce90,&fStack_1ce48);
  fVar3 = fdb_set_log_callback(pfStack_1ce90,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1ce90,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar11 = 0;
    do {
      sprintf(acStack_1cc28,"key%d",uVar11);
      sprintf(acStack_1cb28,"body%d",uVar11);
      pfVar7 = pfStack_1ce90;
      sVar6 = strlen(acStack_1cc28);
      sVar8 = strlen(acStack_1cb28);
      fVar3 = fdb_set_kv(pfVar7,acStack_1cc28,sVar6,acStack_1cb28,sVar8);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar16 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar16;
    } while (uVar16 != 10);
    asStack_1ce78[1] = 0x726162ffffffff;
    asStack_1ce78[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1ce60 = 0xbdbdbdbd;
    uStack_1ce5c = 0xbdbdbdbd;
    uStack_1ce58 = 0xbdbdbdbd;
    uStack_1ce54 = 0xbdbdbdbd;
    uStack_1ce50 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1ce88,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1ce90);
    fdb_close(pfStack_1ce88);
    fStack_1ce20.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1ce20.encryption_key.bytes,"bar",4);
    fStack_1ce20.encryption_key.bytes[4] = 0xbd;
    fStack_1ce20.encryption_key.bytes[5] = 0xbd;
    fStack_1ce20.encryption_key.bytes[6] = 0xbd;
    fStack_1ce20.encryption_key.bytes[7] = 0xbd;
    fStack_1ce20.encryption_key.bytes[8] = 0xbd;
    fStack_1ce20.encryption_key.bytes[9] = 0xbd;
    fStack_1ce20.encryption_key.bytes[10] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xb] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xc] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xd] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xe] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0xf] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x10] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x11] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x12] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x13] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x14] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x15] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x16] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x17] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x18] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x19] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1ce20.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1ce88,"./dummy1",&fStack_1ce20);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1ce88,&pfStack_1ce90,&fStack_1ce48);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1ce90,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar11 = 0;
      while( true ) {
        sprintf(acStack_1cc28,"key%d",uVar11);
        pfVar7 = pfStack_1ce90;
        sVar6 = strlen(acStack_1cc28);
        fVar3 = fdb_get_kv(pfVar7,acStack_1cc28,sVar6,&pvStack_1ce80,asStack_1ce78);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1cd28,"body%d",uVar11);
        ptr = pvStack_1ce80;
        iVar4 = bcmp(pvStack_1ce80,acStack_1cd28,asStack_1ce78[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar16 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar16;
        if (uVar16 == 10) {
          fdb_kvs_close(pfStack_1ce90);
          fdb_close(pfStack_1ce88);
          fdb_shutdown();
          memleak_end();
          pcVar19 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar19 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar19,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
}

Assistant:

void purge_logically_deleted_doc_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* fdb_test_config.json > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 2;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "purge_logically_deleted_doc_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // If the above compaction takes longer than two secs (e.g., slow disk),
            // then, fdb_get_metaonly will return KEY_NOT_FOUND error.
            TEST_CHK(status == FDB_RESULT_SUCCESS ||
                     status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    printf("wait for 3 seconds..\n");
    sleep(3);

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // logically deletec document must be purged during the compaction
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("purge logically deleted doc test");
}